

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O0

bool __thiscall
UnifiedRegex::Parser<NullTerminatedUnicodeEncodingPolicy,_false>::AtQuantifier
          (Parser<NullTerminatedUnicodeEncodingPolicy,_false> *this)

{
  StandardChars<char16_t> *pSVar1;
  bool bVar2;
  EncodedChar EVar3;
  uint uVar4;
  CharCount n;
  bool local_51;
  bool local_45;
  bool local_31;
  CharCount local_1c;
  CharCount saved;
  CharCount lookahead;
  Parser<NullTerminatedUnicodeEncodingPolicy,_false> *this_local;
  
  EVar3 = ECLookahead(this,0);
  uVar4 = (uint)(ushort)EVar3;
  if ((uVar4 - 0x2a < 2) || (uVar4 == 0x3f)) {
    this_local._7_1_ = true;
  }
  else if (uVar4 == 0x7b) {
    local_1c = 1;
    while( true ) {
      bVar2 = ECCanConsume(this,local_1c + 1);
      local_31 = false;
      if (bVar2) {
        pSVar1 = this->standardEncodedChars;
        EVar3 = ECLookahead(this,local_1c);
        local_31 = StandardChars<char16_t>::IsDigit(pSVar1,EVar3);
      }
      if (local_31 == false) break;
      local_1c = local_1c + 1;
    }
    if ((local_1c == 1) || (bVar2 = ECCanConsume(this,local_1c + 1), !bVar2)) {
      this_local._7_1_ = false;
    }
    else {
      EVar3 = ECLookahead(this,local_1c);
      if (EVar3 == L',') {
        n = local_1c + 1;
        bVar2 = ECCanConsume(this,local_1c + 2);
        local_1c = n;
        if ((bVar2) && (EVar3 = ECLookahead(this,n), EVar3 == L'}')) {
          this_local._7_1_ = true;
        }
        else {
          while( true ) {
            bVar2 = ECCanConsume(this,local_1c + 1);
            local_45 = false;
            if (bVar2) {
              pSVar1 = this->standardEncodedChars;
              EVar3 = ECLookahead(this,local_1c);
              local_45 = StandardChars<char16_t>::IsDigit(pSVar1,EVar3);
            }
            if (local_45 == false) break;
            local_1c = local_1c + 1;
          }
          if (local_1c == n) {
            this_local._7_1_ = false;
          }
          else {
            bVar2 = ECCanConsume(this,local_1c + 1);
            local_51 = false;
            if (bVar2) {
              EVar3 = ECLookahead(this,local_1c);
              local_51 = EVar3 == L'}';
            }
            this_local._7_1_ = local_51;
          }
        }
      }
      else if (EVar3 == L'}') {
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Parser<P, IsLiteral>::AtQuantifier()
    {
        // Could be terminating 0
        switch (ECLookahead())
        {
        case '*':
        case '+':
        case '?':
            return true;
        case '{':
            {
                CharCount lookahead = 1;
                while (ECCanConsume(lookahead + 1) && standardEncodedChars->IsDigit(ECLookahead(lookahead)))
                    lookahead++;
                if (lookahead == 1 || !ECCanConsume(lookahead + 1))
                    return false;
                switch (ECLookahead(lookahead))
                {
                case ',':
                    lookahead++;
                    if (ECCanConsume(lookahead + 1) && ECLookahead(lookahead) == '}')
                        return true;
                    else
                    {
                        CharCount saved = lookahead;
                        while (ECCanConsume(lookahead + 1) && standardEncodedChars->IsDigit(ECLookahead(lookahead)))
                            lookahead++;
                        if (lookahead == saved)
                            return false;
                        return ECCanConsume(lookahead + 1) && ECLookahead(lookahead) == '}';
                    }
                case '}':
                    return true;
                default:
                    return false;
                }
            }
        default:
            return false;
        }
    }